

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_sam(DisasContext_conflict13 *s,DisasOps *o)

{
  int iVar1;
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i64 arg2;
  ulong local_40;
  uint64_t mask;
  TCGv_i64 tsam;
  int sam;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = (int)s->insn->data;
  if (iVar1 == 0) {
    local_40 = 0xffffff;
  }
  else if (iVar1 == 1) {
    local_40 = 0x7fffffff;
  }
  else {
    local_40 = 0xffffffffffffffff;
  }
  if (((s->base).pc_next & (local_40 ^ 0xffffffffffffffff)) == 0) {
    s->pc_tmp = local_40 & s->pc_tmp;
    arg2 = tcg_const_i64_s390x(tcg_ctx_00,(long)iVar1);
    tcg_gen_deposit_i64_s390x(tcg_ctx_00,tcg_ctx_00->psw_mask,tcg_ctx_00->psw_mask,arg2,0x1f,2);
    tcg_temp_free_i64(tcg_ctx_00,arg2);
    s_local._4_4_ = DISAS_TARGET_3;
  }
  else {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_sam(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int sam = s->insn->data;
    TCGv_i64 tsam;
    uint64_t mask;

    switch (sam) {
    case 0:
        mask = 0xffffff;
        break;
    case 1:
        mask = 0x7fffffff;
        break;
    default:
        mask = -1;
        break;
    }

    /* Bizarre but true, we check the address of the current insn for the
       specification exception, not the next to be executed.  Thus the PoO
       documents that Bad Things Happen two bytes before the end.  */
    if (s->base.pc_next & ~mask) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }
    s->pc_tmp &= mask;

    tsam = tcg_const_i64(tcg_ctx, sam);
    tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->psw_mask, tcg_ctx->psw_mask, tsam, 31, 2);
    tcg_temp_free_i64(tcg_ctx, tsam);

    /* Always exit the TB, since we (may have) changed execution mode.  */
    return DISAS_PC_STALE;
}